

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::GetDataViewInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ArrayBufferBase *result;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  Var aValue;
  DataView *pDVar2;
  AutoNestedHandledExceptionType local_24 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)70>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar1->VarArray[0]);
  pDVar2 = Js::VarTo<Js::DataView>(aValue);
  result = (pDVar2->super_ArrayBufferParent).arrayBuffer.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType(local_24,ExceptionType_OutOfMemory)
  ;
  JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)70>
            (executeContext,evt,result);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_24);
  return;
}

Assistant:

void GetDataViewInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetDataViewInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::DataView* dataView = Js::VarTo<Js::DataView>(var);
            Js::Var res = dataView->GetArrayBuffer();

            //Need additional notify since JsRTActionHandleResultForReplay may allocate but GetDataViewInfo does not enter runtime
            //Failure will kick all the way out to replay loop -- which is what we want
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetDataViewInfoActionTag>(executeContext, evt, res);
        }